

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range.cc
# Opt level: O3

Range * re2c::Range::sub(Range *r1,Range *r2)

{
  uint32_t *puVar1;
  uint uVar2;
  Range *pRVar3;
  uint uVar4;
  Range **tail;
  Range *pRVar5;
  Range *head;
  Range *local_20;
  
  local_20 = (Range *)0x0;
  if (r1 == (Range *)0x0) {
    local_20 = (Range *)0x0;
  }
  else {
    pRVar5 = (Range *)&local_20;
    do {
      if (r2 == (Range *)0x0) {
        uVar2 = r1->ub;
LAB_0014764b:
        pRVar3 = ran(r1->lb,uVar2);
        pRVar5->nx = pRVar3;
        r1 = r1->nx;
      }
      else {
        uVar4 = r2->lb;
        uVar2 = r1->ub;
        if (uVar2 <= uVar4) goto LAB_0014764b;
        uVar2 = r1->lb;
        if (uVar2 < r2->ub) {
          if (uVar2 < uVar4) {
            pRVar3 = ran(uVar2,uVar4);
            pRVar5->nx = pRVar3;
            pRVar5 = pRVar3;
          }
          do {
            puVar1 = &r2->ub;
            uVar2 = r1->ub;
            pRVar3 = pRVar5;
            if (uVar2 <= *puVar1) goto LAB_00147643;
            r2 = r2->nx;
            if ((r2 == (Range *)0x0) || (uVar4 = r2->lb, uVar2 <= r2->lb)) {
              uVar4 = uVar2;
            }
            pRVar3 = ran(*puVar1,uVar4);
            pRVar5->nx = pRVar3;
            pRVar5 = pRVar3;
          } while (r2 != (Range *)0x0);
          r2 = (Range *)0x0;
LAB_00147643:
          r1 = r1->nx;
        }
        else {
          r2 = r2->nx;
          pRVar3 = pRVar5;
        }
      }
      pRVar5 = pRVar3;
    } while (r1 != (Range *)0x0);
  }
  return local_20;
}

Assistant:

Range * Range::sub (const Range * r1, const Range * r2)
{
	Range * head = NULL;
	Range ** ptail = &head;
	while (r1)
	{
		if (!r2 || r2->lb >= r1->ub)
		{
			append (ptail, r1->lb, r1->ub);
			r1 = r1->nx;
		}
		else if (r2->ub <= r1->lb)
		{
			r2 = r2->nx;
		}
		else
		{
			if (r1->lb < r2->lb)
			{
				append (ptail, r1->lb, r2->lb);
			}
			while (r2 && r2->ub < r1->ub)
			{
				const uint32_t lb = r2->ub;
				r2 = r2->nx;
				const uint32_t ub = r2 && r2->lb < r1->ub
					? r2->lb
					: r1->ub;
				append (ptail, lb, ub);
			}
			r1 = r1->nx;
		}
	}
	return head;
}